

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFPageObjectHelper::forEachXObject
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action,function<bool_(QPDFObjectHandle)> *selector)

{
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  _Manager_type p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  __index_type _Var4;
  QPDFObjGen og;
  QPDF_Dictionary *pQVar5;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar6;
  _Node *p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  undefined7 in_register_00000031;
  QPDFObjectHandle obj;
  list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> queue;
  QPDFObjectHandle xobj_dict;
  set seen;
  QPDFObjectHandle local_100;
  element_type *local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0 [16];
  _List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_d0;
  BaseHandle local_b8;
  undefined1 local_a8 [16];
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  _Any_data *local_78;
  undefined1 local_70 [24];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  local_78 = (_Any_data *)action;
  if ((int)CONCAT71(in_register_00000031,recursive) == 0) {
    local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QPDFObjectHandle::isFormXObject(&local_100);
  }
  else {
    local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_100.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QPDFObjectHandle::isFormXObject(&local_100);
  }
  if (local_100.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  local_d0._M_impl._M_node._M_size = 0;
  local_d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d0;
  local_d0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_d0;
  local_58._M_right = local_58._M_left;
  std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
  _M_insert<QPDFPageObjectHelper&>
            ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)&local_d0,
             (iterator)&local_d0,this);
  if (local_d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_d0) {
    do {
      p_Var2 = local_d0._M_impl._M_node.super__List_node_base._M_next;
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                     ((BaseHandle *)
                      &local_d0._M_impl._M_node.super__List_node_base._M_next[1]._M_prev);
      bVar3 = QPDFObjGen::set::add((set *)(local_70 + 0x10),og);
      if (bVar3) {
        local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Resources","");
        getAttribute((QPDFPageObjectHelper *)local_70,(string *)(p_Var2 + 1),
                     SUB81((string *)&local_b8,0));
        local_f0 = (element_type *)local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/XObject","");
        QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)(local_a8 + 0x10),(string *)local_70);
        if (local_f0 != (element_type *)local_e0) {
          operator_delete(local_f0,local_e0._0_8_ + 1);
        }
        if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if (local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_a8) {
          operator_delete(local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_a8._0_8_ + 1);
        }
        local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        pQVar5 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_b8);
        if (pQVar5 == (QPDF_Dictionary *)0x0) {
          p_Var8 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var8 = (pQVar5->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        pQVar5 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_b8);
        p_Var9 = &(pQVar5->items)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (pQVar5 == (QPDF_Dictionary *)0x0) {
          p_Var9 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var8 != p_Var9; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  **)(p_Var8 + 2);
          if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      *)0x0) {
            _Var4 = (__v->
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ).
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ._M_index;
            if (_Var4 == '\x0f') {
              pvVar6 = std::
                       get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                 (__v);
LAB_001d6d08:
              _Var4 = *(__index_type *)
                       ((long)&(((pvVar6->obj).
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 0x30);
            }
            else if (_Var4 == '\r') {
              pvVar6 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                        *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                        *(QPDFObjGen *)
                                         ((long)&__v[1].
                                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 ._M_u + 0x18));
              goto LAB_001d6d08;
            }
            if (_Var4 != '\x02') {
              local_f0 = *(element_type **)(p_Var8 + 2);
              local_e8 = p_Var8[2]._M_parent;
              if (local_e8 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&local_e8->_M_parent = *(int *)&local_e8->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&local_e8->_M_parent = *(int *)&local_e8->_M_parent + 1;
                }
              }
              p_Var1 = (selector->super__Function_base)._M_manager;
              if (p_Var1 == (_Manager_type)0x0) {
                bVar3 = true;
              }
              else {
                if (local_e8 != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&local_e8->_M_parent = *(int *)&local_e8->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&local_e8->_M_parent = *(int *)&local_e8->_M_parent + 1;
                  }
                }
                local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f0;
                local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
                if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                bVar3 = (*selector->_M_invoker)((_Any_data *)selector,&local_88);
              }
              if ((p_Var1 != (_Manager_type)0x0) &&
                 ((_Base_ptr)
                  local_88.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_88.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if (bVar3 != false) {
                if (*(long *)(local_78 + 1) == 0) {
                  std::__throw_bad_function_call();
                }
                (**(code **)(local_78->_M_pod_data + 0x18))
                          (local_78,(QPDFObjectHandle *)&local_f0,
                           (QPDFObjectHandle *)(local_a8 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var8 + 1));
              }
              if ((recursive) &&
                 (bVar3 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_f0), bVar3)) {
                p_Var7 = std::__cxx11::
                         list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
                         _M_create_node<QPDFObjectHandle&>
                                   ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>
                                     *)&local_d0,(QPDFObjectHandle *)&local_f0);
                std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
                local_d0._M_impl._M_node._M_size = local_d0._M_impl._M_node._M_size + 1;
              }
              if (local_e8 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
              }
            }
          }
        }
        if (local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      p_Var2 = local_d0._M_impl._M_node.super__List_node_base._M_next;
      local_d0._M_impl._M_node._M_size = local_d0._M_impl._M_node._M_size - 1;
      std::__detail::_List_node_base::_M_unhook();
      (*(code *)(p_Var2[1]._M_next)->_M_next)(p_Var2 + 1);
      operator_delete(p_Var2,0x48);
    } while (local_d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_d0)
    ;
  }
  std::__cxx11::_List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::_M_clear
            (&local_d0);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)(local_70 + 0x10));
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachXObject(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action,
    std::function<bool(QPDFObjectHandle)> selector)
{
    QTC::TC(
        "qpdf",
        "QPDFPageObjectHelper::forEachXObject",
        recursive ? (oh().isFormXObject() ? 0 : 1) : (oh().isFormXObject() ? 2 : 3));
    QPDFObjGen::set seen;
    std::list<QPDFPageObjectHelper> queue;
    queue.emplace_back(*this);
    while (!queue.empty()) {
        auto& ph = queue.front();
        if (seen.add(ph)) {
            auto xobj_dict = ph.getAttribute("/Resources", false).getKeyIfDict("/XObject");
            for (auto const& [key, value]: xobj_dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }
                auto obj = value;
                if ((!selector) || selector(obj)) {
                    action(obj, xobj_dict, key);
                }
                if (recursive && obj.isFormXObject()) {
                    queue.emplace_back(obj);
                }
            }
        }
        queue.pop_front();
    }
}